

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void kwssys::SystemTools::ClassInitialize(void)

{
  bool bVar1;
  __type _Var2;
  void *pvVar3;
  ulong uVar4;
  string pwd_path;
  string cwd_str;
  string pwd_changed;
  string cwd_changed;
  char *cwd;
  char buf [2048];
  string pwd_str;
  undefined4 in_stack_fffffffffffff678;
  uint in_stack_fffffffffffff67c;
  string *in_stack_fffffffffffff680;
  char *in_stack_fffffffffffff688;
  string *this;
  bool local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffff6c0;
  undefined1 in_stack_fffffffffffff6c7;
  undefined8 in_stack_fffffffffffff6e8;
  string local_908 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  string *in_stack_fffffffffffff738;
  string *in_stack_fffffffffffff740;
  string local_8a0 [32];
  string local_880 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_860;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  pvVar3 = operator_new(0x30);
  SystemToolsStatic::SystemToolsStatic((SystemToolsStatic *)0x1d315e);
  SystemToolsStatics = pvVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"/tmp/",&local_21);
  AddKeepPath((string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0));
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::__cxx11::string::string(local_58);
  bVar1 = GetEnv(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
  if ((bVar1) &&
     (local_860 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Getcwd((char *)in_stack_fffffffffffff680,in_stack_fffffffffffff67c),
     local_860 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::__cxx11::string::string(local_880);
    std::__cxx11::string::string(local_8a0);
    __lhs = local_860;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff740,(char *)__lhs,
               (allocator *)&stack0xfffffffffffff73f);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff73f);
    __rhs = &local_8e8;
    std::__cxx11::string::string((string *)__rhs);
    Realpath((string *)buf._1376_8_,(string *)buf._1368_8_,(string *)buf._1360_8_);
    while( true ) {
      _Var2 = std::operator==(__lhs,__rhs);
      local_969 = false;
      if (_Var2) {
        local_969 = std::operator!=(in_stack_fffffffffffff680,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678)
                                   );
      }
      if (local_969 == false) break;
      std::__cxx11::string::operator=(local_880,(string *)&stack0xfffffffffffff740);
      std::__cxx11::string::operator=(local_8a0,local_58);
      GetFilenamePath((string *)in_stack_fffffffffffff6e8);
      this = local_908;
      std::__cxx11::string::operator=(local_58,this);
      std::__cxx11::string::~string(this);
      GetFilenamePath((string *)in_stack_fffffffffffff6e8);
      in_stack_fffffffffffff680 = (string *)&stack0xfffffffffffff6d8;
      std::__cxx11::string::operator=
                ((string *)&stack0xfffffffffffff740,(string *)in_stack_fffffffffffff680);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffff680);
      Realpath((string *)buf._1376_8_,(string *)buf._1368_8_,(string *)buf._1360_8_);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      AddTranslationPath(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    }
    std::__cxx11::string::~string((string *)&local_8e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff740);
    std::__cxx11::string::~string(local_8a0);
    std::__cxx11::string::~string(local_880);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void SystemTools::ClassInitialize()
{
#ifdef __VMS
  SetVMSFeature("DECC$FILENAME_UNIX_ONLY", 1);
#endif

  // Create statics singleton instance
  SystemToolsStatics = new SystemToolsStatic;

#if KWSYS_SYSTEMTOOLS_USE_TRANSLATION_MAP
// Add some special translation paths for unix.  These are not added
// for windows because drive letters need to be maintained.  Also,
// there are not sym-links and mount points on windows anyway.
#  if !defined(_WIN32) || defined(__CYGWIN__)
  // The tmp path is frequently a logical path so always keep it:
  SystemTools::AddKeepPath("/tmp/");

  // If the current working directory is a logical path then keep the
  // logical name.
  std::string pwd_str;
  if (SystemTools::GetEnv("PWD", pwd_str)) {
    char buf[2048];
    if (const char* cwd = Getcwd(buf, 2048)) {
      // The current working directory may be a logical path.  Find
      // the shortest logical path that still produces the correct
      // physical path.
      std::string cwd_changed;
      std::string pwd_changed;

      // Test progressively shorter logical-to-physical mappings.
      std::string cwd_str = cwd;
      std::string pwd_path;
      Realpath(pwd_str, pwd_path);
      while (cwd_str == pwd_path && cwd_str != pwd_str) {
        // The current pair of paths is a working logical mapping.
        cwd_changed = cwd_str;
        pwd_changed = pwd_str;

        // Strip off one directory level and see if the logical
        // mapping still works.
        pwd_str = SystemTools::GetFilenamePath(pwd_str);
        cwd_str = SystemTools::GetFilenamePath(cwd_str);
        Realpath(pwd_str, pwd_path);
      }

      // Add the translation to keep the logical path name.
      if (!cwd_changed.empty() && !pwd_changed.empty()) {
        SystemTools::AddTranslationPath(cwd_changed, pwd_changed);
      }
    }
  }
#  endif
#endif
}